

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksToSubprojects
          (cmExtraEclipseCDT4Generator *this,cmGeneratedFileStream *fout,string *baseDir)

{
  string *fout_00;
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *pmVar2;
  pointer ppVar3;
  const_reference ppcVar4;
  cmMakefile *this_00;
  char *pcVar5;
  string local_120;
  allocator local_f9;
  undefined1 local_f8 [8];
  string linkName;
  string local_d0;
  undefined1 local_b0 [8];
  string linkSourceDirectory;
  _Self local_88;
  const_iterator it;
  string local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *baseDir_local;
  cmGeneratedFileStream *fout_local;
  cmExtraEclipseCDT4Generator *this_local;
  
  if ((this->GenerateLinkedResources & 1U) != 0) {
    local_20 = baseDir;
    baseDir_local = (string *)fout;
    fout_local = (cmGeneratedFileStream *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"[Subprojects]",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,"virtual:/virtual",(allocator *)((long)&it._M_node + 7));
    AppendLinkedResource(fout,&local_40,&local_78,VirtualFolder);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    pmVar2 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
         ::begin(pmVar2);
    while( true ) {
      pmVar2 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                         ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
      linkSourceDirectory.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
           ::end(pmVar2);
      bVar1 = std::operator!=(&local_88,(_Self *)((long)&linkSourceDirectory.field_2 + 8));
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
               ::operator->(&local_88);
      ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&ppVar3->second,0);
      this_00 = cmLocalGenerator::GetMakefile(*ppcVar4);
      pcVar5 = cmMakefile::GetCurrentSourceDirectory(this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d0,pcVar5,(allocator *)(linkName.field_2._M_local_buf + 0xf));
      GetEclipsePath((string *)local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)(linkName.field_2._M_local_buf + 0xf));
      bVar1 = std::operator!=(local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b0);
      if ((bVar1) &&
         (bVar1 = cmsys::SystemTools::IsSubDirectory(local_20,(string *)local_b0), !bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_f8,"[Subprojects]/",&local_f9);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
                 ::operator->(&local_88);
        std::__cxx11::string::operator+=((string *)local_f8,(string *)ppVar3);
        fout_00 = baseDir_local;
        GetEclipsePath(&local_120,(string *)local_b0);
        AppendLinkedResource
                  ((cmGeneratedFileStream *)fout_00,(string *)local_f8,&local_120,LinkToFolder);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)local_f8);
      }
      std::__cxx11::string::~string((string *)local_b0);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
      ::operator++(&local_88);
    }
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksToSubprojects(
                       cmGeneratedFileStream& fout, const std::string& baseDir)
{
  if (!this->GenerateLinkedResources)
    {
    return;
    }

  // for each sub project create a linked resource to the source dir
  // - only if it is an out-of-source build
  this->AppendLinkedResource(fout, "[Subprojects]",
                             "virtual:/virtual", VirtualFolder);

  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it != this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    std::string linkSourceDirectory = this->GetEclipsePath(
                   it->second[0]->GetMakefile()->GetCurrentSourceDirectory());
    // a linked resource must not point to a parent directory of .project or
    // .project itself
    if ((baseDir != linkSourceDirectory) &&
        !cmSystemTools::IsSubDirectory(baseDir,
                                       linkSourceDirectory))
      {
      std::string linkName = "[Subprojects]/";
      linkName += it->first;
      this->AppendLinkedResource(fout, linkName,
                                 this->GetEclipsePath(linkSourceDirectory),
                                 LinkToFolder
                                );
      // Don't add it to the srcLinkedResources, because listing multiple
      // directories confuses the Eclipse indexer (#13596).
      }
    }
}